

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

Status leveldb::Table::Open(Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  Rep *pRVar1;
  Rep *pRVar2;
  Rep *pRVar3;
  Rep *pRVar4;
  Rep *pRVar5;
  Rep *pRVar6;
  Rep *pRVar7;
  bool bVar8;
  void *pvVar9;
  undefined8 *puVar10;
  BlockHandle *pBVar11;
  undefined8 uVar12;
  ulong in_RCX;
  Footer *in_RDX;
  Table *in_RSI;
  Footer *in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  Rep *rep;
  Block *index_block;
  Status *s;
  ReadOptions opt;
  Footer footer;
  Slice footer_input;
  BlockContents index_block_contents;
  char footer_space [48];
  Footer *in_stack_fffffffffffffe68;
  Slice *in_stack_fffffffffffffe70;
  Slice *in_stack_fffffffffffffe78;
  BlockContents *in_stack_fffffffffffffe80;
  Rep *in_stack_fffffffffffffe88;
  Footer *this;
  BlockContents *in_stack_ffffffffffffff60;
  BlockHandle *in_stack_ffffffffffffff68;
  ReadOptions *in_stack_ffffffffffffff70;
  RandomAccessFile *in_stack_ffffffffffffff78;
  undefined1 local_80 [72];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_R8 = 0;
  if (in_RCX < 0x30) {
    Slice::Slice(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    Slice::Slice((Slice *)in_stack_fffffffffffffe68);
    Status::Corruption(in_stack_fffffffffffffe70,(Slice *)in_stack_fffffffffffffe68);
    this = in_RDI;
  }
  else {
    this = in_RDI;
    Slice::Slice((Slice *)in_stack_fffffffffffffe68);
    (**(code **)((in_RDX->metaindex_handle_).offset_ + 0x10))
              (in_RDI,in_RDX,in_RCX - 0x30,0x30,local_80,local_38);
    bVar8 = Status::ok((Status *)in_stack_fffffffffffffe68);
    if (bVar8) {
      Footer::Footer(in_stack_fffffffffffffe68);
      Footer::DecodeFrom(this,(Slice *)in_RDI);
      Status::operator=((Status *)in_stack_fffffffffffffe78,(Status *)in_stack_fffffffffffffe70);
      Status::~Status((Status *)in_stack_fffffffffffffe68);
      bVar8 = Status::ok((Status *)in_stack_fffffffffffffe68);
      if (bVar8) {
        BlockContents::BlockContents((BlockContents *)in_stack_fffffffffffffe68);
        bVar8 = Status::ok((Status *)in_stack_fffffffffffffe68);
        if (bVar8) {
          ReadOptions::ReadOptions((ReadOptions *)in_stack_fffffffffffffe68);
          Footer::index_handle(in_stack_fffffffffffffe68);
          ReadBlock(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                    in_stack_ffffffffffffff60);
          Status::operator=((Status *)in_stack_fffffffffffffe78,(Status *)in_stack_fffffffffffffe70)
          ;
          Status::~Status((Status *)in_stack_fffffffffffffe68);
        }
        bVar8 = Status::ok((Status *)in_stack_fffffffffffffe68);
        if (bVar8) {
          pvVar9 = operator_new(0x18);
          Block::Block((Block *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
          puVar10 = (undefined8 *)operator_new(0xa0);
          Rep::Rep(in_stack_fffffffffffffe88);
          pRVar1 = in_RSI[0xb].rep_;
          puVar10[10] = in_RSI[10].rep_;
          puVar10[0xb] = pRVar1;
          pRVar1 = in_RSI[9].rep_;
          puVar10[8] = in_RSI[8].rep_;
          puVar10[9] = pRVar1;
          pRVar1 = in_RSI->rep_;
          pRVar2 = in_RSI[1].rep_;
          pRVar3 = in_RSI[2].rep_;
          pRVar4 = in_RSI[3].rep_;
          pRVar5 = in_RSI[4].rep_;
          pRVar6 = in_RSI[5].rep_;
          pRVar7 = in_RSI[7].rep_;
          puVar10[6] = in_RSI[6].rep_;
          puVar10[7] = pRVar7;
          puVar10[4] = pRVar5;
          puVar10[5] = pRVar6;
          puVar10[2] = pRVar3;
          puVar10[3] = pRVar4;
          *puVar10 = pRVar1;
          puVar10[1] = pRVar2;
          puVar10[0xd] = in_RDX;
          pBVar11 = Footer::metaindex_handle(in_stack_fffffffffffffe68);
          puVar10[0x11] = pBVar11->offset_;
          puVar10[0x12] = pBVar11->size_;
          puVar10[0x13] = pvVar9;
          if (in_RSI[6].rep_ == (Rep *)0x0) {
            uVar12 = 0;
          }
          else {
            uVar12 = (*(code *)((in_RSI[6].rep_)->options).comparator[7]._vptr_Comparator)();
          }
          puVar10[0xe] = uVar12;
          puVar10[0x10] = 0;
          puVar10[0xf] = 0;
          pvVar9 = operator_new(8);
          Table((Table *)in_stack_fffffffffffffe68,(Rep *)0x18c1293);
          *in_R8 = pvVar9;
          ReadMeta(in_RSI,in_RDX);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}